

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O3

REF_STATUS ref_migrate_native_rcb_part(REF_GRID ref_grid,REF_INT npart,REF_INT *node_part)

{
  uint uVar1;
  REF_MPI ref_mpi;
  REF_NODE pRVar2;
  REF_GLOB *pRVar3;
  REF_DBL *pRVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  REF_DBL *xyz;
  REF_INT *owners;
  REF_INT *locals;
  undefined8 uVar9;
  ulong uVar10;
  char *pcVar11;
  long lVar12;
  REF_INT n;
  size_t __size;
  double dVar13;
  REF_DBL psi;
  REF_BOOL in_stack_ffffffffffffff58;
  REF_DBL transform [9];
  
  ref_mpi = ref_grid->mpi;
  pRVar2 = ref_grid->node;
  uVar5 = pRVar2->max;
  if (0 < (int)uVar5) {
    lVar8 = 0;
    do {
      node_part[lVar8] = -1;
      lVar8 = lVar8 + 1;
      uVar5 = pRVar2->max;
    } while (lVar8 < (int)uVar5);
  }
  uVar1 = pRVar2->n;
  if ((int)uVar1 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",0x237
           ,"ref_migrate_native_rcb_part","malloc xyz of REF_DBL negative");
    return 1;
  }
  xyz = (REF_DBL *)malloc((ulong)uVar1 * 0x18);
  if (xyz == (REF_DBL *)0x0) {
    pcVar11 = "malloc xyz of REF_DBL NULL";
    uVar9 = 0x237;
LAB_0020c8db:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",uVar9
           ,"ref_migrate_native_rcb_part",pcVar11);
    return 2;
  }
  __size = (ulong)uVar1 << 2;
  owners = (REF_INT *)malloc(__size);
  if (owners == (REF_INT *)0x0) {
    pcVar11 = "malloc owners of REF_INT NULL";
    uVar9 = 0x238;
    goto LAB_0020c8db;
  }
  locals = (REF_INT *)malloc(__size);
  if (locals == (REF_INT *)0x0) {
    pcVar11 = "malloc locals of REF_INT NULL";
    uVar9 = 0x239;
    goto LAB_0020c8db;
  }
  if ((int)uVar5 < 1) {
    n = 0;
  }
  else {
    pRVar3 = pRVar2->global;
    lVar8 = 0;
    uVar10 = 0;
    n = 0;
    do {
      if ((-1 < pRVar3[uVar10]) && (iVar7 = pRVar2->ref_mpi->id, iVar7 == pRVar2->part[uVar10])) {
        pRVar4 = pRVar2->real;
        lVar12 = 0;
        do {
          xyz[n * 3 + lVar12] = *(REF_DBL *)((long)pRVar4 + lVar12 * 8 + lVar8);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        owners[n] = iVar7;
        locals[n] = (REF_INT)uVar10;
        n = n + 1;
      }
      uVar10 = uVar10 + 1;
      lVar8 = lVar8 + 0x78;
    } while (uVar10 < uVar5);
  }
  if (ref_mpi->id == 0) {
    iVar7 = ref_grid->twod;
    iVar6 = rand();
    dVar13 = 0.0;
    psi = 0.0;
    if (iVar7 == 0) {
      iVar7 = rand();
      dVar13 = ((double)iVar7 + (double)iVar7) / 2147483647.0 + -1.0;
      if (1.0 <= dVar13) {
        dVar13 = 1.0;
      }
      if (dVar13 <= -1.0) {
        dVar13 = -1.0;
      }
      dVar13 = acos(dVar13);
      iVar7 = rand();
      psi = ((double)iVar7 * 6.28318530717958) / 2147483647.0;
    }
    uVar5 = ref_matrix_euler_rotation
                      (((double)iVar6 * 6.28318530717958) / 2147483647.0,dVar13,psi,transform);
    if (uVar5 != 0) {
      pcVar11 = "rot";
      uVar9 = 0x252;
      goto LAB_0020ca16;
    }
  }
  uVar5 = ref_mpi_bcast(ref_mpi,transform,9,3);
  if (uVar5 == 0) {
    uVar5 = ref_migrate_native_rcb_direction
                      (ref_mpi,n,xyz,transform,npart,0,owners,locals,ref_mpi,node_part,
                       ref_grid->partitioner_seed,-1,in_stack_ffffffffffffff58);
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x25a,"ref_migrate_native_rcb_part",(ulong)uVar5,"split");
      return uVar5;
    }
    iVar7 = ref_grid->partitioner_seed + 1;
    if (ref_grid->partitioner_seed < -1) {
      iVar7 = 0;
    }
    ref_grid->partitioner_seed = iVar7;
    free(locals);
    free(owners);
    free(xyz);
    ref_mpi_stopwatch_stop(ref_grid->mpi,"native RCB part");
    return 0;
  }
  pcVar11 = "bcast xform";
  uVar9 = 0x254;
LAB_0020ca16:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",uVar9,
         "ref_migrate_native_rcb_part",(ulong)uVar5,pcVar11);
  return uVar5;
}

Assistant:

REF_FCN static REF_STATUS ref_migrate_native_rcb_part(REF_GRID ref_grid,
                                                      REF_INT npart,
                                                      REF_INT *node_part) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_INT node;
  REF_INT i, n;
  REF_DBL *xyz;
  REF_INT offset;
  REF_INT *owners;
  REF_INT *locals;
  REF_DBL transform[9];

  for (node = 0; node < ref_node_max(ref_node); node++)
    node_part[node] = REF_EMPTY;

  offset = 0;

  n = ref_node_n(ref_node);
  ref_malloc(xyz, 3 * n, REF_DBL);
  ref_malloc(owners, n, REF_INT);
  ref_malloc(locals, n, REF_INT);
  n = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      for (i = 0; i < 3; i++) xyz[i + 3 * n] = ref_node_xyz(ref_node, i, node);
      owners[n] = ref_node_part(ref_node, node);
      locals[n] = node;
      n++;
    }
  }

  if (ref_mpi_once(ref_mpi)) {
    REF_DBL phi, theta, psi, z;
    if (ref_grid_twod(ref_grid)) { /* restrict rotation to x-y plane */
      phi = 2.0 * ref_math_pi * (REF_DBL)(rand()) / (REF_DBL)RAND_MAX;
      theta = 0.0;
      psi = 0.0;
    } else { /* not exactly unirom sampling, should be good enough */
      phi = 2.0 * ref_math_pi * (REF_DBL)(rand()) / (REF_DBL)RAND_MAX;
      z = 2.0 * (REF_DBL)(rand()) / (REF_DBL)RAND_MAX - 1.0;
      z = MAX(MIN(z, 1.0), -1.0); /* redundant nan safety */
      theta = acos(z);
      psi = 2.0 * ref_math_pi * (REF_DBL)(rand()) / (REF_DBL)RAND_MAX;
    }
    /* printf("phi %f theta %f psi %f\n",phi,theta,psi); */
    RSS(ref_matrix_euler_rotation(phi, theta, psi, transform), "rot");
  }
  RSS(ref_mpi_bcast(ref_mpi, transform, 9, REF_DBL_TYPE), "bcast xform");

  RSS(ref_migrate_native_rcb_direction(
          ref_mpi, n, xyz, transform, npart, offset, owners, locals, ref_mpi,
          node_part, ref_grid_partitioner_seed(ref_grid), -1,
          ref_grid_twod(ref_grid)),
      "split");
  ref_grid_partitioner_seed(ref_grid)++;
  if (ref_grid_partitioner_seed(ref_grid) < 0)
    ref_grid_partitioner_seed(ref_grid) = 0; /* overflow int */

  ref_free(locals);
  ref_free(owners);
  ref_free(xyz);

  ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "native RCB part");

  return REF_SUCCESS;
}